

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<ProKey,_ProString> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProString>_>::findNode<ProKey>
          (Data<QHashPrivate::Node<ProKey,_ProString>_> *this,ProKey *key)

{
  ulong uVar1;
  Node<ProKey,_ProString> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<ProKey>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<ProKey,_ProString> *)0x0;
  }
  else {
    pNVar2 = (Node<ProKey,_ProString> *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }